

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

int nng_socket_proto_name(nng_socket id,char **name)

{
  int iVar1;
  nni_sock *in_RAX;
  char *pcVar2;
  nni_sock *local_18;
  nni_sock *sock;
  
  local_18 = in_RAX;
  iVar1 = nni_sock_find(&local_18,id.id);
  if (iVar1 == 0) {
    pcVar2 = nni_sock_proto_name(local_18);
    *name = pcVar2;
    nni_sock_rele(local_18);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nng_socket_proto_name(nng_socket id, const char **name)
{
	int       rv;
	nni_sock *sock;

	if ((rv = nni_sock_find(&sock, id.id)) != 0) {
		return (rv);
	}

	*name = nni_sock_proto_name(sock);
	nni_sock_rele(sock);
	return (0);
}